

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall
haVoc::ScoredMoves::load_and_score
          (ScoredMoves *this,position *p,Movegen *moves,vector<Move,_std::allocator<Move>_> *filters
          ,Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc *score_lambda)

{
  pointer pMVar1;
  U8 *pUVar2;
  long lVar3;
  Move local_4b;
  ScoredMove local_48;
  Move *local_40;
  Move *local_38;
  
  this->m_start = 0;
  this->m_end = 0;
  pUVar2 = &moves->list[0].type;
  local_40 = previous;
  local_38 = followup;
  for (lVar3 = 0; lVar3 < moves->last; lVar3 = lVar3 + 1) {
    local_4b.f = ((Move *)(pUVar2 + -2))->f;
    local_4b.t = pUVar2[-1];
    local_4b.type = *pUVar2;
    pMVar1 = (filters->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((((((local_4b.f != pMVar1->f) || (local_4b.t != pMVar1->t)) ||
          (local_4b.type != pMVar1->type)) &&
         (((local_4b.f != pMVar1[1].f || (local_4b.t != pMVar1[1].t)) ||
          (local_4b.type != pMVar1[1].type)))) &&
        (((local_4b.f != pMVar1[2].f || (local_4b.t != pMVar1[2].t)) ||
         (local_4b.type != pMVar1[2].type)))) &&
       ((((local_4b.f != pMVar1[3].f || (local_4b.t != pMVar1[3].t)) ||
         (local_4b.type != pMVar1[3].type)) &&
        (((local_4b.f != pMVar1[4].f || (local_4b.t != pMVar1[4].t)) ||
         (local_4b.type != pMVar1[4].type)))))) {
      local_48.s = std::
                   function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
                   ::operator()(score_lambda,p,&local_4b,local_40,local_38,threat,stack);
      local_48.m.f = local_4b.f;
      local_48.m.t = local_4b.t;
      local_48.m.type = local_4b.type;
      std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::
      emplace_back<haVoc::ScoredMove>(&this->m_moves,&local_48);
    }
    pUVar2 = pUVar2 + 3;
  }
  return;
}

Assistant:

void ScoredMoves::load_and_score(const position& p, Movegen* moves, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda)
	{
		m_start = m_end = 0;
		for (int i = 0; i < moves->size(); ++i) {
			
			auto m = (*moves)[i];

			// skip hash moves and killers
			if (m == filters[0] || m == filters[1] || m == filters[2] ||
				m == filters[3] || m == filters[4])
				continue;

			Score sc = score_lambda(p, m, previous, followup, threat, stack);
			m_moves.emplace_back(ScoredMove(m, sc));
		}
	}